

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall httplib::detail::SocketStream::is_writable(SocketStream *this)

{
  int iVar1;
  time_t tVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  undefined1 auStack_b8 [8];
  fd_set fds;
  
  iVar1 = this->sock_;
  bVar3 = true;
  if (iVar1 < 0x400) {
    tVar2 = this->write_timeout_sec_;
    fds.fds_bits[0xd] = 0;
    fds.fds_bits[0xe] = 0;
    fds.fds_bits[0xb] = 0;
    fds.fds_bits[0xc] = 0;
    fds.fds_bits[9] = 0;
    fds.fds_bits[10] = 0;
    fds.fds_bits[7] = 0;
    fds.fds_bits[8] = 0;
    fds.fds_bits[5] = 0;
    fds.fds_bits[6] = 0;
    fds.fds_bits[3] = 0;
    fds.fds_bits[4] = 0;
    fds.fds_bits[1] = 0;
    fds.fds_bits[2] = 0;
    auStack_b8 = (undefined1  [8])0x0;
    fds.fds_bits[0] = 0;
    iVar4 = iVar1 + 0x3f;
    if (-1 < iVar1) {
      iVar4 = iVar1;
    }
    fds.fds_bits[(long)(iVar4 >> 6) + -1] =
         fds.fds_bits[(long)(iVar4 >> 6) + -1] | 1L << ((byte)(iVar1 % 0x40) & 0x3f);
    fds.fds_bits[0xf] = tVar2;
    do {
      iVar4 = select(iVar1 + 1,(fd_set *)0x0,(fd_set *)auStack_b8,(fd_set *)0x0,
                     (timeval *)(fds.fds_bits + 0xf));
      if (-1 < iVar4) break;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    bVar3 = 0 < iVar4;
  }
  return bVar3;
}

Assistant:

inline bool SocketStream::is_writable() const {
            return select_write(sock_, write_timeout_sec_, write_timeout_usec_) > 0;
        }